

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O3

void __thiscall
SMBusPacket::CreateDefaultFrames
          (SMBusPacket *this,SMBusAnalyzerResults *pResults,SMBusProtocol *pProt,bool has_pec,
          SMBusDecodeLevel dec_level)

{
  long lVar1;
  pointer pSVar2;
  byte bVar3;
  SMBP_ProtElem SVar4;
  undefined7 in_register_00000009;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  pointer pvVar9;
  Frame f;
  SMBusByte local_90;
  undefined1 local_70;
  undefined1 local_6f;
  SMBusAnalyzerResults *local_68;
  uint local_5c;
  long local_58;
  SMBusPacket *local_50;
  SMBusProtocol *local_48;
  undefined4 local_40;
  SMBusDecodeLevel local_3c;
  long local_38;
  
  local_40 = (undefined4)CONCAT71(in_register_00000009,has_pec);
  SVar4 = pProt->prot_elems[1];
  local_68 = pResults;
  local_3c = dec_level;
  if (SVar4 == SMBP_Stop) {
    lVar5 = 0;
  }
  else {
    local_5c = 0xffffffff;
    bVar3 = 1;
    lVar5 = 0;
    lVar7 = 0;
    local_50 = this;
    local_48 = pProt;
    do {
      if (SMBP_DataBlock < SVar4) goto switchD_00114faa_caseD_1;
      pvVar9 = (this->chunks).
               super__Vector_base<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar7;
      switch(SVar4) {
      case SMBP_Start:
        lVar7 = lVar7 + 1;
        lVar5 = 0;
        break;
      case SMBP_Stop:
        break;
      default:
        SMBusByte::ToAddrFrame
                  (&local_90,
                   (SMBusProtocol *)
                   (lVar5 * 0x20 +
                   *(long *)&(pvVar9->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                             _M_impl.super__Vector_impl_data));
        AnalyzerResults::AddFrame((Frame *)local_68);
        goto LAB_00115191;
      case SMBP_AddrRead:
        SMBusByte::ToAddrFrame
                  (&local_90,
                   (SMBusProtocol *)
                   (lVar5 * 0x20 +
                   *(long *)&(pvVar9->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                             _M_impl.super__Vector_impl_data));
        AnalyzerResults::AddFrame((Frame *)local_68);
LAB_00115191:
        Frame::~Frame((Frame *)&local_90);
        lVar5 = lVar5 + 1;
        break;
      case SMBP_Command:
        if (local_3c == DL_SmartBattery) {
          lVar1 = *(long *)&(pvVar9->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                            _M_impl.super__Vector_impl_data;
          lVar8 = lVar5 * 0x20;
          Frame::Frame((Frame *)&local_90);
          local_70 = 0xc;
          local_90._0_8_ = **(undefined8 **)(lVar1 + 8 + lVar8);
          local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
          _M_impl.super__Vector_impl_data._M_start =
               *(pointer *)(*(long *)(lVar1 + 0x10 + lVar8) + -0x20);
          local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)*(byte *)(lVar1 + lVar8);
          local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_6f = *(undefined1 *)(lVar1 + 1 + lVar8);
          AnalyzerResults::AddFrame((Frame *)local_68);
          Frame::~Frame((Frame *)&local_90);
          this = local_50;
        }
        else {
          if (local_3c == DL_PMBus) {
            lVar1 = *(long *)&(pvVar9->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                              _M_impl.super__Vector_impl_data;
            lVar8 = lVar5 * 0x20;
            local_58 = lVar7;
            Frame::Frame((Frame *)&local_90);
            local_70 = 0xb;
            local_90._0_8_ = **(undefined8 **)(lVar1 + 8 + lVar8);
            local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 *(pointer *)(*(long *)(lVar1 + 0x10 + lVar8) + -0x20);
            local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)*(byte *)(lVar1 + lVar8);
            local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_6f = *(undefined1 *)(lVar1 + 1 + lVar8);
            AnalyzerResults::AddFrame((Frame *)local_68);
          }
          else {
            lVar1 = *(long *)&(pvVar9->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                              _M_impl.super__Vector_impl_data;
            lVar8 = lVar5 * 0x20;
            local_58 = lVar7;
            Frame::Frame((Frame *)&local_90);
            local_70 = 10;
            local_90._0_8_ = **(undefined8 **)(lVar1 + 8 + lVar8);
            local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 *(pointer *)(*(long *)(lVar1 + 0x10 + lVar8) + -0x20);
            local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)*(byte *)(lVar1 + lVar8);
            local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_6f = *(undefined1 *)(lVar1 + 1 + lVar8);
            AnalyzerResults::AddFrame((Frame *)local_68);
          }
          Frame::~Frame((Frame *)&local_90);
          lVar7 = local_58;
        }
        lVar5 = lVar5 + 1;
        pProt = local_48;
        break;
      case SMBP_CommandExt:
        lVar1 = *(long *)&(pvVar9->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                          _M_impl.super__Vector_impl_data;
        lVar8 = lVar5 * 0x20;
        Frame::Frame((Frame *)&local_90);
        local_70 = 0xb;
        local_90._0_8_ = **(undefined8 **)(lVar1 + 8 + lVar8);
        local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_start =
             *(pointer *)(*(long *)(lVar1 + 0x30 + lVar8) + -0x20);
        local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)(ulong)CONCAT11(*(undefined1 *)(lVar1 + lVar8),
                                      *(undefined1 *)(lVar1 + 0x20 + lVar8));
        local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_6f = *(undefined1 *)(lVar1 + 1 + lVar8);
        AnalyzerResults::AddFrame((Frame *)local_68);
        goto LAB_001150a9;
      case SMBP_DataByte:
        lVar1 = *(long *)&(pvVar9->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                          _M_impl.super__Vector_impl_data;
        lVar8 = lVar5 * 0x20;
        Frame::Frame((Frame *)&local_90);
        local_70 = 6;
        local_90._0_8_ = **(undefined8 **)(lVar1 + 8 + lVar8);
        local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_start =
             *(pointer *)(*(long *)(lVar1 + 0x10 + lVar8) + -0x20);
        local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)*(byte *)(lVar1 + lVar8);
        local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_6f = *(undefined1 *)(lVar1 + 1 + lVar8);
        AnalyzerResults::AddFrame((Frame *)local_68);
        Frame::~Frame((Frame *)&local_90);
        lVar5 = lVar5 + 1;
        pProt = local_48;
        this = local_50;
        break;
      case SMBP_DataWord:
        lVar1 = *(long *)&(pvVar9->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                          _M_impl.super__Vector_impl_data;
        lVar8 = lVar5 * 0x20;
        Frame::Frame((Frame *)&local_90);
        local_70 = 7;
        local_90._0_8_ = **(undefined8 **)(lVar1 + 8 + lVar8);
        local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_start =
             *(pointer *)(*(long *)(lVar1 + 0x30 + lVar8) + -0x20);
        local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)(ulong)CONCAT11(*(undefined1 *)(lVar1 + lVar8),
                                      *(undefined1 *)(lVar1 + 0x20 + lVar8));
        local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_6f = *(undefined1 *)(lVar1 + 1 + lVar8);
        AnalyzerResults::AddFrame((Frame *)local_68);
LAB_001150a9:
        Frame::~Frame((Frame *)&local_90);
        lVar5 = lVar5 + 2;
        pProt = local_48;
        this = local_50;
        break;
      case SMBP_ByteCount:
        lVar1 = *(long *)&(pvVar9->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                          _M_impl.super__Vector_impl_data;
        lVar8 = lVar5 * 0x20;
        local_58 = lVar7;
        Frame::Frame((Frame *)&local_90);
        local_70 = 0xd;
        local_90._0_8_ = **(undefined8 **)(lVar1 + 8 + lVar8);
        local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_start =
             *(pointer *)(*(long *)(lVar1 + 0x10 + lVar8) + -0x20);
        local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)*(byte *)(lVar1 + lVar8);
        local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_6f = *(undefined1 *)(lVar1 + 1 + lVar8);
        AnalyzerResults::AddFrame((Frame *)local_68);
        Frame::~Frame((Frame *)&local_90);
        local_5c = (uint)*(byte *)(*(long *)&(pvVar9->
                                             super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>
                                             )._M_impl.super__Vector_impl_data + lVar8);
        lVar5 = lVar5 + 1;
        pProt = local_48;
        this = local_50;
        lVar7 = local_58;
        break;
      case SMBP_DataBlock:
        local_58 = lVar7;
        local_38 = lVar5;
        if (0 < (int)local_5c) {
          uVar6 = (ulong)local_5c;
          lVar5 = lVar5 << 5;
          do {
            lVar7 = *(long *)&(pvVar9->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>).
                              _M_impl.super__Vector_impl_data;
            Frame::Frame((Frame *)&local_90);
            local_70 = 6;
            local_90._0_8_ = **(undefined8 **)(lVar7 + 8 + lVar5);
            local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 *(pointer *)(*(long *)(lVar7 + 0x10 + lVar5) + -0x20);
            local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)*(byte *)(lVar7 + lVar5);
            local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_6f = *(undefined1 *)(lVar7 + 1 + lVar5);
            AnalyzerResults::AddFrame((Frame *)local_68);
            Frame::~Frame((Frame *)&local_90);
            lVar5 = lVar5 + 0x20;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        lVar5 = local_38 + (int)local_5c;
        local_5c = 0xffffffff;
        pProt = local_48;
        this = local_50;
        lVar7 = local_58;
      }
switchD_00114faa_caseD_1:
      bVar3 = bVar3 + 1;
      SVar4 = pProt->prot_elems[bVar3];
    } while (SVar4 != SMBP_Stop);
  }
  if (((char)local_40 != '\0') &&
     (pvVar9 = (this->chunks).
               super__Vector_base<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
     pSVar2 = pvVar9[-1].super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>._M_impl.
              super__Vector_impl_data._M_finish,
     (int)((ulong)((long)pSVar2 -
                  (long)pvVar9[-1].super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>._M_impl
                        .super__Vector_impl_data._M_start) >> 5) - (int)lVar5 == 1)) {
    bVar3 = CalcPEC(this,true);
    Frame::Frame((Frame *)&local_90);
    local_70 = 9;
    local_90._0_8_ =
         (pSVar2[-1].signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>
          ._M_impl.super__Vector_impl_data._M_start)->sample_begin;
    local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)pSVar2[-1].signals.
                  super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].sample_end;
    local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)(ulong)pSVar2[-1].value;
    local_90.signals.super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)bVar3;
    local_6f = pSVar2[-1].is_acked;
    AnalyzerResults::AddFrame((Frame *)local_68);
    Frame::~Frame((Frame *)&local_90);
  }
  return;
}

Assistant:

void SMBusPacket::CreateDefaultFrames( SMBusAnalyzerResults* pResults, const SMBusProtocol* pProt, bool has_pec,
                                       SMBusDecodeLevel dec_level ) const
{
    const SMBP_ProtElem* pProtElems = pProt->prot_elems;

    U8 prot_elem_ndx = 1; // skip the initial Start

    size_t bcnt = 0, chnkcnt = 0;
    bool should_end_on_nack = false;
    int byte_count = -1;
    while( pProtElems[ prot_elem_ndx ] != SMBP_Stop )
    {
        const std::vector<SMBusByte>& chunk( chunks[ chnkcnt ] );

        switch( pProtElems[ prot_elem_ndx ] )
        {
        case SMBP_Start:
            bcnt = 0;
            ++chnkcnt;
            break;
        case SMBP_AddrAny:
        case SMBP_AddrWrite:
        case SMBP_AddrHostWrite:
            pResults->AddFrame( chunk[ bcnt ].ToAddrFrame( pProt ) );
            ++bcnt;
            should_end_on_nack = false;
            break;
        case SMBP_AddrRead:
            pResults->AddFrame( chunk[ bcnt ].ToAddrFrame( pProt ) );
            ++bcnt;
            should_end_on_nack = true;
            break;
        case SMBP_Command:
            if( dec_level == DL_PMBus )
                pResults->AddFrame( chunk[ bcnt ].ToPMBusCommandFrame() );
            else if( dec_level == DL_SmartBattery )
                pResults->AddFrame( chunk[ bcnt ].ToSmartBatteryCommandFrame() );
            else
                pResults->AddFrame( chunk[ bcnt ].ToSMBusCommandFrame() );

            ++bcnt;
            break;
        case SMBP_CommandExt:
            pResults->AddFrame( chunk[ bcnt ].ToPMBusCommandExtFrame( chunk[ bcnt + 1 ] ) );
            bcnt += 2;
            break;
        case SMBP_DataByte:
            pResults->AddFrame( chunk[ bcnt ].ToDataByte() );
            ++bcnt;
            break;
        case SMBP_DataWord:
            pResults->AddFrame( chunk[ bcnt ].ToDataWord( chunk[ bcnt + 1 ] ) );
            bcnt += 2;
            break;
        case SMBP_ByteCount:
            pResults->AddFrame( chunk[ bcnt ].ToByteCount() );
            byte_count = chunk[ bcnt ].value;
            ++bcnt;
            break;
        case SMBP_DataBlock:

            // create byte blocks
            int c;
            for( c = 0; c < byte_count; ++c )
                pResults->AddFrame( chunk[ bcnt + c ].ToDataByte() );

            bcnt += byte_count;

            byte_count = -1;

            break;
        }

        ++prot_elem_ndx;
    }

    int bytes_remaining = chunks.back().size() - bcnt;

    if( has_pec && bytes_remaining == 1 )
        pResults->AddFrame( chunks.back().back().ToPECFrame( CalcPEC( has_pec ) ) );
}